

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardMazeBuilder.cpp
# Opt level: O1

void __thiscall StandardMazeBuilder::BuildDoor(StandardMazeBuilder *this,int n1,int n2)

{
  int iVar1;
  int iVar2;
  Room *pRVar3;
  Room *pRVar4;
  Door *this_00;
  
  pRVar3 = (Room *)Maze::RoomNo((int)this->_currentMaze);
  pRVar4 = (Room *)Maze::RoomNo((int)this->_currentMaze);
  this_00 = (Door *)operator_new(0x18);
  Door::Door(this_00,pRVar3,pRVar4);
  iVar1 = Room::GetRoomNumber();
  iVar2 = Room::GetRoomNumber();
  Room::SetSide((Direction)pRVar3,(MapSite *)(ulong)(iVar1 < iVar2 ^ 3));
  iVar1 = Room::GetRoomNumber();
  iVar2 = Room::GetRoomNumber();
  Room::SetSide((Direction)pRVar4,(MapSite *)(ulong)(iVar1 < iVar2 ^ 3));
  return;
}

Assistant:

void StandardMazeBuilder::BuildDoor (int n1, int n2) {
    Room* r1 = _currentMaze->RoomNo(n1);
    Room* r2 = _currentMaze->RoomNo(n2);
    Door* d = new Door(r1, r2);

    r1->SetSide(CommonWall(r1,r2), d);
    r2->SetSide(CommonWall(r2,r1), d);
}